

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O1

char * state_align_search_hyp(ps_search_t *search,int32 *out_score)

{
  dictword_t *pdVar1;
  bool bVar2;
  int iVar3;
  ps_alignment_iter_t *ppVar4;
  ps_alignment_entry_t *ppVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  
  if (search->hyp_str != (char *)0x0) {
    ckd_free(search->hyp_str);
  }
  search->hyp_str = (char *)0x0;
  if (((ps_alignment_t *)search[1].type == (ps_alignment_t *)0x0) ||
     (ppVar4 = ps_alignment_words((ps_alignment_t *)search[1].type),
     ppVar4 == (ps_alignment_iter_t *)0x0)) {
LAB_00114b88:
    pcVar7 = (char *)0x0;
  }
  else {
    lVar8 = 0;
    do {
      ppVar5 = ps_alignment_iter_get(ppVar4);
      iVar3 = dict_real_word(search->dict,(ppVar5->id).wid);
      bVar2 = true;
      if (iVar3 != 0) {
        pdVar1 = search->dict->word;
        ppVar5 = ps_alignment_iter_get(ppVar4);
        pcVar7 = pdVar1[pdVar1[(ppVar5->id).wid].basewid].word;
        if (pcVar7 == (char *)0x0) {
          ppVar5 = ps_alignment_iter_get(ppVar4);
          bVar2 = false;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                  ,0x188,"Unknown word id %d in alignment",(ulong)(uint)(ppVar5->id).wid);
        }
        else {
          sVar6 = strlen(pcVar7);
          lVar8 = lVar8 + sVar6 + 1;
        }
      }
      if (!bVar2) goto LAB_00114b88;
      ppVar4 = ps_alignment_iter_next(ppVar4);
    } while (ppVar4 != (ps_alignment_iter_t *)0x0);
    pcVar7 = (char *)__ckd_calloc__(lVar8 + 1,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                    ,0x18e);
    search->hyp_str = pcVar7;
    for (ppVar4 = ps_alignment_words((ps_alignment_t *)search[1].type);
        ppVar4 != (ps_alignment_iter_t *)0x0; ppVar4 = ps_alignment_iter_next(ppVar4)) {
      ppVar5 = ps_alignment_iter_get(ppVar4);
      iVar3 = dict_real_word(search->dict,(ppVar5->id).wid);
      if (iVar3 != 0) {
        pdVar1 = search->dict->word;
        strcat(search->hyp_str,pdVar1[pdVar1[(ppVar5->id).wid].basewid].word);
        pcVar7 = search->hyp_str;
        sVar6 = strlen(pcVar7);
        pcVar7 = pcVar7 + sVar6;
        pcVar7[0] = ' ';
        pcVar7[1] = '\0';
      }
      *out_score = ppVar5->score;
    }
    pcVar7 = search->hyp_str;
    sVar6 = strlen(pcVar7);
    pcVar7[sVar6 - 1] = '\0';
    pcVar7 = search->hyp_str;
  }
  return pcVar7;
}

Assistant:

static char const *
state_align_search_hyp(ps_search_t *search, int32 *out_score)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    ps_alignment_iter_t *itor;
    size_t hyp_len;

    if (search->hyp_str)
        ckd_free(search->hyp_str);
    search->hyp_str = NULL;
    if (sas->al == NULL)
        return NULL;
    itor = ps_alignment_words(sas->al);
    if (itor == NULL)
        return NULL;
    for (hyp_len = 0; itor; itor = ps_alignment_iter_next(itor)) {
        const char *word;
        int32 wid = ps_alignment_iter_get(itor)->id.wid;

        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ps_alignment_iter_get(itor)->id.wid);
            if (word == NULL) {
                E_ERROR("Unknown word id %d in alignment",
                        ps_alignment_iter_get(itor)->id.wid);
                return NULL;
            }
            hyp_len += strlen(word) + 1;
        }
    }
    search->hyp_str = ckd_calloc(hyp_len + 1, sizeof(*search->hyp_str));
    for (itor = ps_alignment_words(sas->al);
         itor; itor = ps_alignment_iter_next(itor)) {
        ps_alignment_entry_t *ent = ps_alignment_iter_get(itor);
        int32 wid = ent->id.wid;
        const char *word;
        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ent->id.wid);
            strcat(search->hyp_str, word);
            strcat(search->hyp_str, " ");
        }
        *out_score = ent->score;
    }
    search->hyp_str[strlen(search->hyp_str) - 1] = '\0';
    return search->hyp_str;
}